

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

DInterpolation * __thiscall sector_t::SetInterpolation(sector_t *this,int position,bool attach)

{
  DInterpolation *pDVar1;
  DSectorPlaneInterpolation *this_00;
  int *obj;
  
  obj = this->terrainnum + (long)position * 2 + 8;
  pDVar1 = GC::ReadBarrier<DInterpolation>((DInterpolation **)obj);
  if (pDVar1 == (DInterpolation *)0x0) {
    switch(position) {
    case 0:
      this_00 = (DSectorPlaneInterpolation *)DObject::operator_new(0x80);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                (this_00,(sector_t_conflict *)this,true,attach);
      break;
    case 1:
      this_00 = (DSectorPlaneInterpolation *)DObject::operator_new(0x80);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                (this_00,(sector_t_conflict *)this,false,attach);
      break;
    case 2:
      this_00 = (DSectorPlaneInterpolation *)DObject::operator_new(0x70);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)this_00,(sector_t_conflict *)this,true);
      break;
    case 3:
      this_00 = (DSectorPlaneInterpolation *)DObject::operator_new(0x70);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)this_00,(sector_t_conflict *)this,false);
      break;
    default:
      return (DInterpolation *)0x0;
    }
    *(DSectorPlaneInterpolation **)obj = this_00;
  }
  pDVar1 = GC::ReadBarrier<DInterpolation>((DInterpolation **)obj);
  pDVar1->refcount = pDVar1->refcount + 1;
  pDVar1 = GC::ReadBarrier<DInterpolation>((DInterpolation **)obj);
  GC::WriteBarrier(&pDVar1->super_DObject);
  pDVar1 = GC::ReadBarrier<DInterpolation>((DInterpolation **)obj);
  return pDVar1;
}

Assistant:

DInterpolation *sector_t::SetInterpolation(int position, bool attach)
{
	if (interpolations[position] == NULL)
	{
		DInterpolation *interp;
		switch (position)
		{
		case sector_t::CeilingMove:
			interp = new DSectorPlaneInterpolation(this, true, attach);
			break;

		case sector_t::FloorMove:
			interp = new DSectorPlaneInterpolation(this, false, attach);
			break;

		case sector_t::CeilingScroll:
			interp = new DSectorScrollInterpolation(this, true);
			break;

		case sector_t::FloorScroll:
			interp = new DSectorScrollInterpolation(this, false);
			break;

		default:
			return NULL;
		}
		interpolations[position] = interp;
	}
	interpolations[position]->AddRef();
	GC::WriteBarrier(interpolations[position]);
	return interpolations[position];
}